

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err_test.cc
# Opt level: O3

void __thiscall ErrTest_SaveAndRestore_Test::TestBody(ErrTest_SaveAndRestore_Test *this)

{
  uint uVar1;
  _Head_base<0UL,_err_save_state_st_*,_false> state;
  ulong uVar2;
  ERR_SAVE_STATE *pEVar3;
  pointer *__ptr_1;
  pointer *__ptr;
  int iVar4;
  char *pcVar5;
  char *in_R9;
  bool bVar6;
  ScopedTrace gtest_trace_223;
  ScopedTrace gtest_trace_220;
  int line;
  int flags;
  ScopedTrace gtest_trace_174;
  char *data;
  UniquePtr<ERR_SAVE_STATE> saved;
  char *file;
  AssertHelper local_98;
  AssertHelper local_90;
  undefined1 local_88 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  ScopedTrace local_62;
  ScopedTrace local_61;
  int local_60;
  int local_5c;
  uint local_58;
  int local_54;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_50;
  _Head_base<0UL,_err_save_state_st_*,_false> local_48;
  Message local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  
  ERR_put_error(1,0,1,"test1.c",1);
  ERR_put_error(2,0,2,"test2.c",2);
  ERR_add_error_data(1,"data1");
  ERR_restore_state((ERR_SAVE_STATE *)0x0);
  local_40.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = 0;
  uVar2 = ERR_get_error();
  local_48._M_head_impl._0_4_ = (int)uVar2;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
            ((internal *)local_88,"0u","ERR_get_error()",(uint *)&local_40,(uint *)&local_48);
  if (local_88[0] == (internal)0x0) {
    testing::Message::Message(&local_40);
    if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_80->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x96,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_48,&local_40);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_48);
    if ((long *)CONCAT44(local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._4_4_,
                         local_40.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_4_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._4_4_,
                                     local_40.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_4_) + 8))();
    }
  }
  if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_80,local_80);
  }
  ERR_put_error(1,0,1,"test1.c",1);
  ERR_add_error_data(1);
  ERR_put_error(2,0,2,"test2.c",2);
  ERR_put_error(3,0,3,"test3.c",3);
  ERR_add_error_data(1,"data3");
  local_48._M_head_impl = ERR_save_state();
  local_40.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ =
       CONCAT31(local_40.ss_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._1_3_,local_48._M_head_impl != (ERR_SAVE_STATE *)0x0);
  local_38 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_48._M_head_impl == (ERR_SAVE_STATE *)0x0) {
    testing::Message::Message((Message *)&local_50);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_88,(internal *)&local_40,(AssertionResult *)"saved","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
               ,0x9f,(char *)CONCAT71(local_88._1_7_,local_88[0]));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_50);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_88._1_7_,local_88[0]) != &local_78) {
      operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT71(local_88._1_7_,local_88[0]),local_78._M_allocated_capacity + 1);
    }
    if (local_50._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_50._M_head_impl + 8))();
    }
    if (local_38 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_38,local_38);
    }
  }
  else {
    uVar2 = ERR_get_error_line_data((char **)&local_40,&local_60,(char **)&local_50,&local_5c);
    local_98.data_._0_4_ = (uint)uVar2 >> 0x18;
    local_90.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"ERR_GET_LIB(packed_error)","1",(int *)&local_98,
               (int *)&local_90);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa5,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98.data_._0_4_ = (uint)uVar2 & 0xfff;
    local_90.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"ERR_GET_REASON(packed_error)","1",(int *)&local_98,
               (int *)&local_90);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa6,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    testing::internal::CmpHelperSTREQ
              ((internal *)local_88,"\"test1.c\"","file","test1.c",
               (char *)CONCAT44(local_40.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_,
                                local_40.ss_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._0_4_));
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa7,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98.data_._0_4_ = 1;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"line","1",&local_60,(int *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa8,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    testing::internal::CmpHelperSTREQ
              ((internal *)local_88,"data","\"data1\"",(char *)local_50._M_head_impl,"data1");
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xa9,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_98.data_._0_4_ = 3;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)local_88,"flags","1 | 2",&local_5c,(int *)&local_98);
    if (local_88[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_98);
      if (local_80 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        pcVar5 = "";
      }
      else {
        pcVar5 = (local_80->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_90,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xaa,pcVar5);
      testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
      testing::internal::AssertHelper::~AssertHelper(&local_90);
      if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
        (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
      }
    }
    if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_80,local_80);
    }
    local_58 = 0;
    do {
      testing::ScopedTrace::ScopedTrace<unsigned_int>
                ((ScopedTrace *)&local_54,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xae,&local_58);
      ERR_restore_state(local_48._M_head_impl);
      uVar2 = ERR_get_error_line_data((char **)&local_40,&local_60,(char **)&local_50,&local_5c);
      local_98.data_._0_4_ = (uint)uVar2 >> 0x18;
      local_90.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"ERR_GET_LIB(packed_error)","1",(int *)&local_98,
                 (int *)&local_90);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb2,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = (uint)uVar2 & 0xfff;
      local_90.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"ERR_GET_REASON(packed_error)","1",(int *)&local_98,
                 (int *)&local_90);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb3,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)local_88,"\"test1.c\"","file","test1.c",
                 (char *)CONCAT44(local_40.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  local_40.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_4_));
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = 1;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"line","1",&local_60,(int *)&local_98);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb5,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)local_88,"data","\"data1\"",(char *)local_50._M_head_impl,"data1");
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb6,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = 3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"flags","1 | 2",&local_5c,(int *)&local_98);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xb7,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      uVar2 = ERR_get_error_line_data((char **)&local_40,&local_60,(char **)&local_50,&local_5c);
      local_98.data_._0_4_ = (uint)uVar2 >> 0x18;
      local_90.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"ERR_GET_LIB(packed_error)","2",(int *)&local_98,
                 (int *)&local_90);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xba,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = (uint)uVar2 & 0xfff;
      local_90.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"ERR_GET_REASON(packed_error)","2",(int *)&local_98,
                 (int *)&local_90);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbb,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)local_88,"\"test2.c\"","file","test2.c",
                 (char *)CONCAT44(local_40.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  local_40.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_4_));
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbc,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = 2;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"line","2",&local_60,(int *)&local_98);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbd,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)local_88,"data","\"\"",(char *)local_50._M_head_impl,"");
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbe,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = 0;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"flags","0",&local_5c,(int *)&local_98);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xbf,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      uVar2 = ERR_get_error_line_data((char **)&local_40,&local_60,(char **)&local_50,&local_5c);
      local_98.data_._0_4_ = (uint)uVar2 >> 0x18;
      local_90.data_._0_4_ = 3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"ERR_GET_LIB(packed_error)","3",(int *)&local_98,
                 (int *)&local_90);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc2,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = (uint)uVar2 & 0xfff;
      local_90.data_._0_4_ = 3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"ERR_GET_REASON(packed_error)","3",(int *)&local_98,
                 (int *)&local_90);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc3,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)local_88,"\"test3.c\"","file","test3.c",
                 (char *)CONCAT44(local_40.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._4_4_,
                                  local_40.ss_._M_t.
                                  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  .
                                  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                  ._M_head_impl._0_4_));
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc4,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = 3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"line","3",&local_60,(int *)&local_98);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc5,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      testing::internal::CmpHelperSTREQ
                ((internal *)local_88,"data","\"data3\"",(char *)local_50._M_head_impl,"data3");
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xc6,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = 3;
      testing::internal::CmpHelperEQ<int,int>
                ((internal *)local_88,"flags","1 | 2",&local_5c,(int *)&local_98);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,199,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      local_98.data_._0_4_ = 0;
      uVar2 = ERR_get_error();
      local_90.data_._0_4_ = (undefined4)uVar2;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)local_88,"0u","ERR_get_error()",(uint *)&local_98,(uint *)&local_90);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xca,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      testing::ScopedTrace::~ScopedTrace((ScopedTrace *)&local_54);
      local_58 = local_58 + 1;
    } while (local_58 < 2);
    ERR_clear_error();
    iVar4 = 8;
    do {
      ERR_put_error(0,0,0,"invalid",0);
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
    iVar4 = 1;
    do {
      ERR_put_error(iVar4,0,iVar4,"test",iVar4);
      iVar4 = iVar4 + 1;
    } while (iVar4 != 0x10);
    pEVar3 = ERR_save_state();
    state._M_head_impl = local_48._M_head_impl;
    bVar6 = local_48._M_head_impl != (ERR_SAVE_STATE *)0x0;
    local_48._M_head_impl = pEVar3;
    if (bVar6) {
      ERR_SAVE_STATE_free(state._M_head_impl);
    }
    ERR_get_error();
    local_58 = 0;
    do {
      testing::ScopedTrace::ScopedTrace<int>
                (&local_61,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                 ,0xdc,(int *)&local_58);
      ERR_restore_state(local_48._M_head_impl);
      local_54 = 1;
      do {
        testing::ScopedTrace::ScopedTrace<int>
                  (&local_62,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xdf,&local_54);
        uVar2 = ERR_get_error_line_data((char **)&local_40,&local_60,(char **)&local_50,&local_5c);
        local_98.data_._0_4_ = (uint)uVar2 >> 0x18;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"ERR_GET_LIB(packed_error)","j",(int *)&local_98,&local_54);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          pcVar5 = "";
          if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                     ,0xe1,pcVar5);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        local_98.data_._0_4_ = (uint)uVar2 & 0xfff;
        testing::internal::CmpHelperEQ<int,int>
                  ((internal *)local_88,"ERR_GET_REASON(packed_error)","j",(int *)&local_98,
                   &local_54);
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          pcVar5 = "";
          if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                     ,0xe2,pcVar5);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        testing::internal::CmpHelperSTREQ
                  ((internal *)local_88,"\"test\"","file","test",
                   (char *)CONCAT44(local_40.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._4_4_,
                                    local_40.ss_._M_t.
                                    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                    ._M_head_impl._0_4_));
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          pcVar5 = "";
          if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                     ,0xe3,pcVar5);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        testing::internal::CmpHelperEQ<int,int>((internal *)local_88,"line","j",&local_60,&local_54)
        ;
        if (local_88[0] == (internal)0x0) {
          testing::Message::Message((Message *)&local_98);
          pcVar5 = "";
          if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
          {
            pcVar5 = (local_80->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_90,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                     ,0xe4,pcVar5);
          testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
          testing::internal::AssertHelper::~AssertHelper(&local_90);
          if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
          }
        }
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_80,local_80);
        }
        testing::ScopedTrace::~ScopedTrace(&local_62);
        iVar4 = local_54 + 1;
        bVar6 = local_54 < 0xf;
        local_54 = iVar4;
      } while (bVar6);
      local_98.data_._0_4_ = 0;
      uVar2 = ERR_get_error();
      local_90.data_._0_4_ = (undefined4)uVar2;
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)local_88,"0u","ERR_get_error()",(uint *)&local_98,(uint *)&local_90);
      if (local_88[0] == (internal)0x0) {
        testing::Message::Message((Message *)&local_98);
        pcVar5 = "";
        if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          pcVar5 = (local_80->_M_dataplus)._M_p;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_90,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/err/err_test.cc"
                   ,0xe7,pcVar5);
        testing::internal::AssertHelper::operator=(&local_90,(Message *)&local_98);
        testing::internal::AssertHelper::~AssertHelper(&local_90);
        if ((long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) != (long *)0x0) {
          (**(code **)(*(long *)CONCAT44(local_98.data_._4_4_,(uint)local_98.data_) + 8))();
        }
      }
      if (local_80 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_80,local_80);
      }
      testing::ScopedTrace::~ScopedTrace(&local_61);
      uVar1 = local_58 + 1;
      bVar6 = (int)local_58 < 1;
      local_58 = uVar1;
    } while (bVar6);
  }
  std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<err_save_state_st,_bssl::internal::Deleter> *)&local_48);
  return;
}

Assistant:

TEST(ErrTest, SaveAndRestore) {
  // Restoring no state clears the error queue, including error data.
  ERR_put_error(1, 0 /* unused */, 1, "test1.c", 1);
  ERR_put_error(2, 0 /* unused */, 2, "test2.c", 2);
  ERR_add_error_data(1, "data1");
  ERR_restore_state(nullptr);
  EXPECT_EQ(0u, ERR_get_error());

  // Add some entries to the error queue and save it.
  ERR_put_error(1, 0 /* unused */, 1, "test1.c", 1);
  ERR_add_error_data(1, "data1");
  ERR_put_error(2, 0 /* unused */, 2, "test2.c", 2);
  ERR_put_error(3, 0 /* unused */, 3, "test3.c", 3);
  ERR_add_error_data(1, "data3");
  bssl::UniquePtr<ERR_SAVE_STATE> saved(ERR_save_state());
  ASSERT_TRUE(saved);

  // The existing error queue entries still exist.
  int line, flags;
  const char *file, *data;
  uint32_t packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
  EXPECT_EQ(ERR_GET_LIB(packed_error), 1);
  EXPECT_EQ(ERR_GET_REASON(packed_error), 1);
  EXPECT_STREQ("test1.c", file);
  EXPECT_EQ(line, 1);
  EXPECT_STREQ(data, "data1");
  EXPECT_EQ(flags, ERR_FLAG_STRING | ERR_FLAG_MALLOCED);

  // The state may be restored, both over an empty and non-empty state.
  for (unsigned i = 0; i < 2; i++) {
    SCOPED_TRACE(i);
    ERR_restore_state(saved.get());

    packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
    EXPECT_EQ(ERR_GET_LIB(packed_error), 1);
    EXPECT_EQ(ERR_GET_REASON(packed_error), 1);
    EXPECT_STREQ("test1.c", file);
    EXPECT_EQ(line, 1);
    EXPECT_STREQ(data, "data1");
    EXPECT_EQ(flags, ERR_FLAG_STRING | ERR_FLAG_MALLOCED);

    packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
    EXPECT_EQ(ERR_GET_LIB(packed_error), 2);
    EXPECT_EQ(ERR_GET_REASON(packed_error), 2);
    EXPECT_STREQ("test2.c", file);
    EXPECT_EQ(line, 2);
    EXPECT_STREQ(data, "");  // No error data is reported as the empty string.
    EXPECT_EQ(flags, 0);

    packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
    EXPECT_EQ(ERR_GET_LIB(packed_error), 3);
    EXPECT_EQ(ERR_GET_REASON(packed_error), 3);
    EXPECT_STREQ("test3.c", file);
    EXPECT_EQ(line, 3);
    EXPECT_STREQ(data, "data3");
    EXPECT_EQ(flags, ERR_FLAG_STRING | ERR_FLAG_MALLOCED);

    // The error queue is now empty for the next iteration.
    EXPECT_EQ(0u, ERR_get_error());
  }

  // Test a case where the error queue wraps around. The first set of errors
  // will all be discarded, but result in wrapping the list around.
  ERR_clear_error();
  for (unsigned i = 0; i < ERR_NUM_ERRORS / 2; i++) {
    ERR_put_error(0, 0 /* unused */, 0, "invalid", 0);
  }
  for (unsigned i = 1; i < ERR_NUM_ERRORS; i++) {
    ERR_put_error(i, 0 /* unused */, i, "test", i);
  }
  saved.reset(ERR_save_state());

  // The state may be restored, both over an empty and non-empty state. Pop one
  // error off so the first iteration is tested to not be a no-op.
  ERR_get_error();
  for (int i = 0; i < 2; i++) {
    SCOPED_TRACE(i);
    ERR_restore_state(saved.get());
    for (int j = 1; j < ERR_NUM_ERRORS; j++) {
      SCOPED_TRACE(j);
      packed_error = ERR_get_error_line_data(&file, &line, &data, &flags);
      EXPECT_EQ(ERR_GET_LIB(packed_error), j);
      EXPECT_EQ(ERR_GET_REASON(packed_error), j);
      EXPECT_STREQ("test", file);
      EXPECT_EQ(line, j);
    }
    // The error queue is now empty for the next iteration.
    EXPECT_EQ(0u, ERR_get_error());
  }
}